

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMax(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *__return_storage_ptr__,
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *uvec,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *p_low,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_up,
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *eps,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 p_delta,Status *stat,int start,int incr)

{
  uint *puVar1;
  pointer pnVar2;
  pointer pnVar3;
  pointer pnVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  bool bVar9;
  type_conflict5 tVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  Real local_990;
  cpp_dec_float<100U,_int,_void> *local_988;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_980;
  cpp_dec_float<100U,_int,_void> local_978;
  cpp_dec_float<100U,_int,_void> local_928;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_8d0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_8c8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_8c0;
  Random *local_8b8;
  cpp_dec_float<100U,_int,_void> *local_8b0;
  cpp_dec_float<100U,_int,_void> local_8a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_858;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_808;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_768;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_718;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_678;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxrandom;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minrandom;
  cpp_dec_float<100U,_int,_void> local_170;
  cpp_dec_float<100U,_int,_void> local_120;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  pnVar2 = (uvec->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  maxrandom.m_backend.data._M_elems[0] = 0;
  maxrandom.m_backend.data._M_elems[1] = 0x40240000;
  minrandom.m_backend.fpclass = cpp_dec_float_finite;
  minrandom.m_backend.prec_elem = 0x10;
  minrandom.m_backend.data._M_elems[0] = 0;
  minrandom.m_backend.data._M_elems[1] = 0;
  minrandom.m_backend.data._M_elems[2] = 0;
  minrandom.m_backend.data._M_elems[3] = 0;
  minrandom.m_backend.data._M_elems[4] = 0;
  minrandom.m_backend.data._M_elems[5] = 0;
  minrandom.m_backend.data._M_elems[6] = 0;
  minrandom.m_backend.data._M_elems[7] = 0;
  minrandom.m_backend.data._M_elems[8] = 0;
  minrandom.m_backend.data._M_elems[9] = 0;
  minrandom.m_backend.data._M_elems[10] = 0;
  minrandom.m_backend.data._M_elems[0xb] = 0;
  minrandom.m_backend.data._M_elems[0xc] = 0;
  minrandom.m_backend.data._M_elems[0xd] = 0;
  minrandom.m_backend.data._M_elems._56_5_ = 0;
  minrandom.m_backend.data._M_elems[0xf]._1_3_ = 0;
  minrandom.m_backend.exp = 0;
  minrandom.m_backend.neg = false;
  local_988 = &__return_storage_ptr__->m_backend;
  local_980 = uvec;
  local_8d0 = this;
  local_8c8 = p_low;
  local_8c0 = p_up;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
            (&minrandom.m_backend,
             (cpp_dec_float<100U,_int,_void> *)p_delta.m_backend.data._M_elems._0_8_,
             (double *)&maxrandom);
  local_8a8.data._M_elems._0_8_ = 100.0;
  maxrandom.m_backend.fpclass = cpp_dec_float_finite;
  maxrandom.m_backend.prec_elem = 0x10;
  maxrandom.m_backend.data._M_elems[0] = 0;
  maxrandom.m_backend.data._M_elems[1] = 0;
  maxrandom.m_backend.data._M_elems[2] = 0;
  maxrandom.m_backend.data._M_elems[3] = 0;
  maxrandom.m_backend.data._M_elems[4] = 0;
  maxrandom.m_backend.data._M_elems[5] = 0;
  maxrandom.m_backend.data._M_elems[6] = 0;
  maxrandom.m_backend.data._M_elems[7] = 0;
  maxrandom.m_backend.data._M_elems[8] = 0;
  maxrandom.m_backend.data._M_elems[9] = 0;
  maxrandom.m_backend.data._M_elems[10] = 0;
  maxrandom.m_backend.data._M_elems[0xb] = 0;
  maxrandom.m_backend.data._M_elems[0xc] = 0;
  maxrandom.m_backend.data._M_elems[0xd] = 0;
  maxrandom.m_backend.data._M_elems._56_5_ = 0;
  maxrandom.m_backend.data._M_elems[0xf]._1_3_ = 0;
  maxrandom.m_backend.exp = 0;
  maxrandom.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
            (&maxrandom.m_backend,
             (cpp_dec_float<100U,_int,_void> *)p_delta.m_backend.data._M_elems._0_8_,
             (double *)&local_8a8);
  pSVar8 = local_8d0;
  local_8a8.fpclass = cpp_dec_float_finite;
  local_8a8.prec_elem = 0x10;
  local_8a8.data._M_elems._0_8_ = 0.0;
  local_8a8.data._M_elems[2] = 0;
  local_8a8.data._M_elems[3] = 0;
  local_8a8.data._M_elems[4] = 0;
  local_8a8.data._M_elems[5] = 0;
  local_8a8.data._M_elems[6] = 0;
  local_8a8.data._M_elems[7] = 0;
  local_8a8.data._M_elems[8] = 0;
  local_8a8.data._M_elems[9] = 0;
  local_8a8.data._M_elems[10] = 0;
  local_8a8.data._M_elems[0xb] = 0;
  local_8a8.data._M_elems[0xc] = 0;
  local_8a8.data._M_elems[0xd] = 0;
  local_8a8.data._M_elems._56_5_ = 0;
  local_8a8.data._M_elems[0xf]._1_3_ = 0;
  local_8a8.exp = 0;
  local_8a8.neg = false;
  local_978.fpclass = cpp_dec_float_finite;
  local_978.prec_elem = 0x10;
  local_978.data._M_elems[0] = 0;
  local_978.data._M_elems[1] = 0;
  local_978.data._M_elems[2] = 0;
  local_978.data._M_elems[3] = 0;
  local_978.data._M_elems[4] = 0;
  local_978.data._M_elems[5] = 0;
  local_978.data._M_elems[6] = 0;
  local_978.data._M_elems[7] = 0;
  local_978.data._M_elems[8] = 0;
  local_978.data._M_elems[9] = 0;
  local_978.data._M_elems[10] = 0;
  local_978.data._M_elems[0xb] = 0;
  local_978.data._M_elems[0xc] = 0;
  local_978.data._M_elems[0xd] = 0;
  local_978.data._M_elems[0xe] = 0;
  local_978.data._M_elems[0xf] = 0;
  local_978.exp = 0;
  local_978.neg = false;
  local_928.fpclass = cpp_dec_float_finite;
  local_928.prec_elem = 0x10;
  local_928.data._M_elems[0] = 0;
  local_928.data._M_elems[1] = 0;
  local_928.data._M_elems[2] = 0;
  local_928.data._M_elems[3] = 0;
  local_928.data._M_elems[4] = 0;
  local_928.data._M_elems[5] = 0;
  local_928.data._M_elems[6] = 0;
  local_928.data._M_elems[7] = 0;
  local_928.data._M_elems[8] = 0;
  local_928.data._M_elems[9] = 0;
  local_928.data._M_elems[10] = 0;
  local_928.data._M_elems[0xb] = 0;
  local_928.data._M_elems[0xc] = 0;
  local_928.data._M_elems[0xd] = 0;
  local_928.data._M_elems[0xe] = 0;
  local_928.data._M_elems[0xf] = 0;
  local_928.exp = 0;
  local_928.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (local_988,0,(type *)0x0);
  if (pSVar8->fullPerturbation == true) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&eps->m_backend,
               (cpp_dec_float<100U,_int,_void> *)p_delta.m_backend.data._M_elems._0_8_);
    for (uVar14 = ~p_delta.m_backend.data._M_elems[4] +
                  (int)(((long)(local_980->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_980->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x50); -1 < (int)uVar14;
        uVar14 = uVar14 - p_delta.m_backend.data._M_elems[6]) {
      uVar12 = (ulong)uVar14;
      pnVar3 = (local_8c0->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_928.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[uVar12].m_backend.data;
      local_928.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[uVar12].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x10);
      local_928.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_928.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x20);
      local_928.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_928.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x30);
      local_928.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      local_928.data._M_elems[0xe] = (uint)uVar7;
      local_928.data._M_elems[0xf] = (uint)((ulong)uVar7 >> 0x20);
      local_928.exp = pnVar3[uVar12].m_backend.exp;
      local_928.neg = pnVar3[uVar12].m_backend.neg;
      local_858.m_backend.fpclass = pnVar3[uVar12].m_backend.fpclass;
      local_858.m_backend.prec_elem = pnVar3[uVar12].m_backend.prec_elem;
      local_928.prec_elem = local_858.m_backend.prec_elem;
      local_928.fpclass = local_858.m_backend.fpclass;
      pnVar3 = (local_8c8->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_978.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[uVar12].m_backend.data;
      local_978.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[uVar12].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x10);
      local_978.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_978.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x20);
      local_978.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_978.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x30);
      local_978.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      local_978.data._M_elems[0xe] = (uint)uVar7;
      local_978.data._M_elems[0xf] = (uint)((ulong)uVar7 >> 0x20);
      local_978.exp = pnVar3[uVar12].m_backend.exp;
      local_978.neg = pnVar3[uVar12].m_backend.neg;
      local_978.fpclass = pnVar3[uVar12].m_backend.fpclass;
      local_978.prec_elem = pnVar3[uVar12].m_backend.prec_elem;
      local_980 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pnVar2 + uVar12);
      local_8a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[uVar12].m_backend;
      local_8a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[uVar12].m_backend + 8);
      local_8a8.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar2 + uVar12) + 0x10);
      local_8a8.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar2 + uVar12) + 0x18);
      local_8a8.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar2 + uVar12) + 0x20);
      local_8a8.data._M_elems._40_8_ = *(undefined8 *)((long)(pnVar2 + uVar12) + 0x28);
      local_8a8.data._M_elems._48_8_ = *(undefined8 *)((long)(pnVar2 + uVar12) + 0x30);
      uVar7 = *(undefined8 *)((long)(pnVar2 + uVar12) + 0x38);
      local_8a8.data._M_elems._56_5_ = SUB85(uVar7,0);
      local_8a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_8a8.exp = *(int *)((long)(pnVar2 + uVar12) + 0x40);
      local_8a8.neg = *(bool *)((long)(pnVar2 + uVar12) + 0x44);
      local_8a8._72_8_ = *(undefined8 *)((long)(pnVar2 + uVar12) + 0x48);
      local_858.m_backend.data._M_elems[0] = local_928.data._M_elems[0];
      local_858.m_backend.data._M_elems[1] = local_928.data._M_elems[1];
      local_858.m_backend.data._M_elems[2] = local_928.data._M_elems[2];
      local_858.m_backend.data._M_elems[3] = local_928.data._M_elems[3];
      local_858.m_backend.data._M_elems[4] = local_928.data._M_elems[4];
      local_858.m_backend.data._M_elems[5] = local_928.data._M_elems[5];
      local_858.m_backend.data._M_elems[6] = local_928.data._M_elems[6];
      local_858.m_backend.data._M_elems[7] = local_928.data._M_elems[7];
      local_858.m_backend.data._M_elems[8] = local_928.data._M_elems[8];
      local_858.m_backend.data._M_elems[9] = local_928.data._M_elems[9];
      local_858.m_backend.data._M_elems[10] = local_928.data._M_elems[10];
      local_858.m_backend.data._M_elems[0xb] = local_928.data._M_elems[0xb];
      local_858.m_backend.data._M_elems[0xc] = local_928.data._M_elems[0xc];
      local_858.m_backend.data._M_elems[0xd] = local_928.data._M_elems[0xd];
      local_858.m_backend.data._M_elems[0xe] = local_928.data._M_elems[0xe];
      local_858.m_backend.data._M_elems[0xf] = local_928.data._M_elems[0xf];
      local_858.m_backend.exp = local_928.exp;
      local_858.m_backend.neg = local_928.neg;
      pdVar11 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&local_80,*pdVar11,(type *)0x0);
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4)
      ;
      local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6)
      ;
      local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8)
      ;
      local_268.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 10);
      local_268.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
      local_268.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
      local_268.m_backend.exp = (eps->m_backend).exp;
      local_268.m_backend.neg = (eps->m_backend).neg;
      local_268.m_backend.fpclass = (eps->m_backend).fpclass;
      local_268.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar9 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_858,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_80,&local_268);
      if (bVar9) {
        local_2b8.m_backend.data._M_elems[0xf] = local_978.data._M_elems[0xf];
        local_2b8.m_backend.data._M_elems[0xe] = local_978.data._M_elems[0xe];
        local_2b8.m_backend.data._M_elems[0xc] = local_978.data._M_elems[0xc];
        local_2b8.m_backend.data._M_elems[0xd] = local_978.data._M_elems[0xd];
        local_2b8.m_backend.data._M_elems[8] = local_978.data._M_elems[8];
        local_2b8.m_backend.data._M_elems[9] = local_978.data._M_elems[9];
        local_2b8.m_backend.data._M_elems[10] = local_978.data._M_elems[10];
        local_2b8.m_backend.data._M_elems[0xb] = local_978.data._M_elems[0xb];
        local_2b8.m_backend.data._M_elems[4] = local_978.data._M_elems[4];
        local_2b8.m_backend.data._M_elems[5] = local_978.data._M_elems[5];
        local_2b8.m_backend.data._M_elems[6] = local_978.data._M_elems[6];
        local_2b8.m_backend.data._M_elems[7] = local_978.data._M_elems[7];
        local_2b8.m_backend.data._M_elems[0] = local_978.data._M_elems[0];
        local_2b8.m_backend.data._M_elems[1] = local_978.data._M_elems[1];
        local_2b8.m_backend.data._M_elems[2] = local_978.data._M_elems[2];
        local_2b8.m_backend.data._M_elems[3] = local_978.data._M_elems[3];
        local_2b8.m_backend.exp = local_978.exp;
        local_2b8.m_backend.neg = local_978.neg;
        local_2b8.m_backend.fpclass = local_978.fpclass;
        local_2b8.m_backend.prec_elem = local_978.prec_elem;
        local_308.m_backend.data._M_elems[0xf] = local_928.data._M_elems[0xf];
        local_308.m_backend.data._M_elems[0xe] = local_928.data._M_elems[0xe];
        local_308.m_backend.data._M_elems[0] = local_928.data._M_elems[0];
        local_308.m_backend.data._M_elems[1] = local_928.data._M_elems[1];
        local_308.m_backend.data._M_elems[2] = local_928.data._M_elems[2];
        local_308.m_backend.data._M_elems[3] = local_928.data._M_elems[3];
        local_308.m_backend.data._M_elems[4] = local_928.data._M_elems[4];
        local_308.m_backend.data._M_elems[5] = local_928.data._M_elems[5];
        local_308.m_backend.data._M_elems[6] = local_928.data._M_elems[6];
        local_308.m_backend.data._M_elems[7] = local_928.data._M_elems[7];
        local_308.m_backend.data._M_elems[8] = local_928.data._M_elems[8];
        local_308.m_backend.data._M_elems[9] = local_928.data._M_elems[9];
        local_308.m_backend.data._M_elems[10] = local_928.data._M_elems[10];
        local_308.m_backend.data._M_elems[0xb] = local_928.data._M_elems[0xb];
        local_308.m_backend.data._M_elems[0xc] = local_928.data._M_elems[0xc];
        local_308.m_backend.data._M_elems[0xd] = local_928.data._M_elems[0xd];
        local_308.m_backend.exp = local_928.exp;
        local_308.m_backend.neg = local_928.neg;
        local_308.m_backend.fpclass = local_928.fpclass;
        local_308.m_backend.prec_elem = local_928.prec_elem;
        local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_358.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_358.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_358.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_358.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_358.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_358.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_358.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_358.m_backend.exp = (eps->m_backend).exp;
        local_358.m_backend.neg = (eps->m_backend).neg;
        local_358.m_backend.fpclass = (eps->m_backend).fpclass;
        local_358.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar9 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_2b8,&local_308,&local_358);
        if (bVar9) {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems._56_5_ = 0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result_1.m_backend,&local_8a8,&eps->m_backend);
          tVar10 = boost::multiprecision::operator<=
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_928,&result_1);
          if ((tVar10) &&
             (*(int *)(p_delta.m_backend.data._M_elems._8_8_ + uVar12 * 4) * local_8d0->theRep < 0))
          {
            dVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                              (&minrandom.m_backend);
            dVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                              (&maxrandom.m_backend);
            local_990 = Random::next(&pSVar8->random,dVar5,dVar6);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems._56_5_ = 0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                      (&result_1.m_backend,(cpp_dec_float<100U,_int,_void> *)local_980,&local_990);
            pnVar3 = (local_8c0->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x30);
            *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._48_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT35(result_1.m_backend.data._M_elems[0xf]._1_3_,
                          result_1.m_backend.data._M_elems._56_5_);
            puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x20);
            *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._32_8_;
            *(undefined8 *)(puVar1 + 2) = result_1.m_backend.data._M_elems._40_8_;
            puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x10);
            *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
            *(undefined8 *)(puVar1 + 2) = result_1.m_backend.data._M_elems._24_8_;
            *(undefined8 *)&pnVar3[uVar12].m_backend.data = result_1.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar3[uVar12].m_backend.data + 8) =
                 result_1.m_backend.data._M_elems._8_8_;
            pnVar3[uVar12].m_backend.exp = result_1.m_backend.exp;
            pnVar3[uVar12].m_backend.neg = result_1.m_backend.neg;
            pnVar3[uVar12].m_backend.fpclass = result_1.m_backend.fpclass;
            pnVar3[uVar12].m_backend.prec_elem = result_1.m_backend.prec_elem;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems._56_5_ = 0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result_1.m_backend,
                       &(local_8c0->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar12].m_backend,&local_928);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (local_988,&result_1.m_backend);
          }
        }
      }
      local_3a8.m_backend.data._M_elems[0xc] = local_978.data._M_elems[0xc];
      local_3a8.m_backend.data._M_elems[0xd] = local_978.data._M_elems[0xd];
      local_3a8.m_backend.data._M_elems[0xe] = local_978.data._M_elems[0xe];
      local_3a8.m_backend.data._M_elems[0xf] = local_978.data._M_elems[0xf];
      local_3a8.m_backend.data._M_elems[8] = local_978.data._M_elems[8];
      local_3a8.m_backend.data._M_elems[9] = local_978.data._M_elems[9];
      local_3a8.m_backend.data._M_elems[10] = local_978.data._M_elems[10];
      local_3a8.m_backend.data._M_elems[0xb] = local_978.data._M_elems[0xb];
      local_3a8.m_backend.data._M_elems[4] = local_978.data._M_elems[4];
      local_3a8.m_backend.data._M_elems[5] = local_978.data._M_elems[5];
      local_3a8.m_backend.data._M_elems[6] = local_978.data._M_elems[6];
      local_3a8.m_backend.data._M_elems[7] = local_978.data._M_elems[7];
      local_3a8.m_backend.data._M_elems[0] = local_978.data._M_elems[0];
      local_3a8.m_backend.data._M_elems[1] = local_978.data._M_elems[1];
      local_3a8.m_backend.data._M_elems[2] = local_978.data._M_elems[2];
      local_3a8.m_backend.data._M_elems[3] = local_978.data._M_elems[3];
      local_3a8.m_backend.exp = local_978.exp;
      local_3a8.m_backend.neg = local_978.neg;
      local_3a8.m_backend.fpclass = local_978.fpclass;
      local_3a8.m_backend.prec_elem = local_978.prec_elem;
      pdVar11 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&local_d0,-*pdVar11,(type *)0x0);
      local_3f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_3f8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_3f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4)
      ;
      local_3f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6)
      ;
      local_3f8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8)
      ;
      local_3f8.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 10);
      local_3f8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
      local_3f8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
      local_3f8.m_backend.exp = (eps->m_backend).exp;
      local_3f8.m_backend.neg = (eps->m_backend).neg;
      local_3f8.m_backend.fpclass = (eps->m_backend).fpclass;
      local_3f8.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar9 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_3a8,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d0,&local_3f8);
      if (bVar9) {
        local_448.m_backend.data._M_elems[0xf] = local_978.data._M_elems[0xf];
        local_448.m_backend.data._M_elems[0xe] = local_978.data._M_elems[0xe];
        local_448.m_backend.data._M_elems[0xc] = local_978.data._M_elems[0xc];
        local_448.m_backend.data._M_elems[0xd] = local_978.data._M_elems[0xd];
        local_448.m_backend.data._M_elems[8] = local_978.data._M_elems[8];
        local_448.m_backend.data._M_elems[9] = local_978.data._M_elems[9];
        local_448.m_backend.data._M_elems[10] = local_978.data._M_elems[10];
        local_448.m_backend.data._M_elems[0xb] = local_978.data._M_elems[0xb];
        local_448.m_backend.data._M_elems[4] = local_978.data._M_elems[4];
        local_448.m_backend.data._M_elems[5] = local_978.data._M_elems[5];
        local_448.m_backend.data._M_elems[6] = local_978.data._M_elems[6];
        local_448.m_backend.data._M_elems[7] = local_978.data._M_elems[7];
        local_448.m_backend.data._M_elems[0] = local_978.data._M_elems[0];
        local_448.m_backend.data._M_elems[1] = local_978.data._M_elems[1];
        local_448.m_backend.data._M_elems[2] = local_978.data._M_elems[2];
        local_448.m_backend.data._M_elems[3] = local_978.data._M_elems[3];
        local_448.m_backend.exp = local_978.exp;
        local_448.m_backend.neg = local_978.neg;
        local_448.m_backend.fpclass = local_978.fpclass;
        local_448.m_backend.prec_elem = local_978.prec_elem;
        local_498.m_backend.data._M_elems[0xf] = local_928.data._M_elems[0xf];
        local_498.m_backend.data._M_elems[0xe] = local_928.data._M_elems[0xe];
        local_498.m_backend.data._M_elems[0] = local_928.data._M_elems[0];
        local_498.m_backend.data._M_elems[1] = local_928.data._M_elems[1];
        local_498.m_backend.data._M_elems[2] = local_928.data._M_elems[2];
        local_498.m_backend.data._M_elems[3] = local_928.data._M_elems[3];
        local_498.m_backend.data._M_elems[4] = local_928.data._M_elems[4];
        local_498.m_backend.data._M_elems[5] = local_928.data._M_elems[5];
        local_498.m_backend.data._M_elems[6] = local_928.data._M_elems[6];
        local_498.m_backend.data._M_elems[7] = local_928.data._M_elems[7];
        local_498.m_backend.data._M_elems[8] = local_928.data._M_elems[8];
        local_498.m_backend.data._M_elems[9] = local_928.data._M_elems[9];
        local_498.m_backend.data._M_elems[10] = local_928.data._M_elems[10];
        local_498.m_backend.data._M_elems[0xb] = local_928.data._M_elems[0xb];
        local_498.m_backend.data._M_elems[0xc] = local_928.data._M_elems[0xc];
        local_498.m_backend.data._M_elems[0xd] = local_928.data._M_elems[0xd];
        local_498.m_backend.exp = local_928.exp;
        local_498.m_backend.neg = local_928.neg;
        local_498.m_backend.fpclass = local_928.fpclass;
        local_498.m_backend.prec_elem = local_928.prec_elem;
        local_4e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_4e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_4e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_4e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_4e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_4e8.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_4e8.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_4e8.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_4e8.m_backend.exp = (eps->m_backend).exp;
        local_4e8.m_backend.neg = (eps->m_backend).neg;
        local_4e8.m_backend.fpclass = (eps->m_backend).fpclass;
        local_4e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar9 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_448,&local_498,&local_4e8);
        if (bVar9) {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems._56_5_ = 0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result_1.m_backend,&local_8a8,&eps->m_backend);
          tVar10 = boost::multiprecision::operator>=
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_978,&result_1);
          if ((tVar10) &&
             (*(int *)(p_delta.m_backend.data._M_elems._8_8_ + uVar12 * 4) * local_8d0->theRep < 0))
          {
            dVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                              (&minrandom.m_backend);
            dVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                              (&maxrandom.m_backend);
            local_990 = Random::next(&pSVar8->random,dVar5,dVar6);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems._56_5_ = 0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                      (&result_1.m_backend,(cpp_dec_float<100U,_int,_void> *)local_980,&local_990);
            pnVar3 = (local_8c8->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x30);
            *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._48_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT35(result_1.m_backend.data._M_elems[0xf]._1_3_,
                          result_1.m_backend.data._M_elems._56_5_);
            puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x20);
            *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._32_8_;
            *(undefined8 *)(puVar1 + 2) = result_1.m_backend.data._M_elems._40_8_;
            puVar1 = (uint *)((long)&pnVar3[uVar12].m_backend.data + 0x10);
            *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
            *(undefined8 *)(puVar1 + 2) = result_1.m_backend.data._M_elems._24_8_;
            *(undefined8 *)&pnVar3[uVar12].m_backend.data = result_1.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar3[uVar12].m_backend.data + 8) =
                 result_1.m_backend.data._M_elems._8_8_;
            pnVar3[uVar12].m_backend.exp = result_1.m_backend.exp;
            pnVar3[uVar12].m_backend.neg = result_1.m_backend.neg;
            pnVar3[uVar12].m_backend.fpclass = result_1.m_backend.fpclass;
            pnVar3[uVar12].m_backend.prec_elem = result_1.m_backend.prec_elem;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems._56_5_ = 0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result_1.m_backend,
                       &(local_8c8->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar12].m_backend,&local_978);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (local_988,&result_1.m_backend);
          }
        }
      }
    }
  }
  else {
    pnVar3 = (local_980->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_8b8 = &pSVar8->random;
    for (uVar14 = ~p_delta.m_backend.data._M_elems[4] + (local_980->thedelta).super_IdxSet.num;
        -1 < (int)uVar14; uVar14 = uVar14 - p_delta.m_backend.data._M_elems[6]) {
      lVar13 = (long)(local_980->thedelta).super_IdxSet.idx[uVar14];
      local_8a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[lVar13].m_backend.data;
      local_8a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[lVar13].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[lVar13].m_backend.data + 0x10);
      local_8a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_8a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[lVar13].m_backend.data + 0x20);
      local_8a8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_8a8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[lVar13].m_backend.data + 0x30);
      local_8a8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      local_8a8.data._M_elems._56_5_ = SUB85(uVar7,0);
      local_8a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_8a8.exp = pnVar3[lVar13].m_backend.exp;
      local_8a8.neg = pnVar3[lVar13].m_backend.neg;
      local_8a8.fpclass = pnVar3[lVar13].m_backend.fpclass;
      local_8a8.prec_elem = pnVar3[lVar13].m_backend.prec_elem;
      pnVar4 = (local_8c0->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_928.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[lVar13].m_backend.data;
      local_928.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[lVar13].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x10);
      local_928.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_928.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x20);
      local_928.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_928.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x30);
      local_928.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      local_928.data._M_elems[0xe] = (uint)uVar7;
      local_928.data._M_elems[0xf] = (uint)((ulong)uVar7 >> 0x20);
      local_928.exp = pnVar4[lVar13].m_backend.exp;
      local_928.neg = pnVar4[lVar13].m_backend.neg;
      local_928.fpclass = pnVar4[lVar13].m_backend.fpclass;
      local_928.prec_elem = pnVar4[lVar13].m_backend.prec_elem;
      pnVar4 = (local_8c8->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_978.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[lVar13].m_backend.data;
      local_978.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[lVar13].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x10);
      local_978.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_978.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x20);
      local_978.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_978.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x30);
      local_978.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      local_978.data._M_elems[0xe] = (uint)uVar7;
      local_978.data._M_elems[0xf] = (uint)((ulong)uVar7 >> 0x20);
      local_978.exp = pnVar4[lVar13].m_backend.exp;
      local_978.neg = pnVar4[lVar13].m_backend.neg;
      local_978.fpclass = pnVar4[lVar13].m_backend.fpclass;
      local_978.prec_elem = pnVar4[lVar13].m_backend.prec_elem;
      tVar10 = boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_8a8,eps);
      if (tVar10) {
        local_538.m_backend.data._M_elems[0xc] = local_928.data._M_elems[0xc];
        local_538.m_backend.data._M_elems[0xd] = local_928.data._M_elems[0xd];
        local_538.m_backend.data._M_elems[0xe] = local_928.data._M_elems[0xe];
        local_538.m_backend.data._M_elems[0xf] = local_928.data._M_elems[0xf];
        local_538.m_backend.data._M_elems[8] = local_928.data._M_elems[8];
        local_538.m_backend.data._M_elems[9] = local_928.data._M_elems[9];
        local_538.m_backend.data._M_elems[10] = local_928.data._M_elems[10];
        local_538.m_backend.data._M_elems[0xb] = local_928.data._M_elems[0xb];
        local_538.m_backend.data._M_elems[4] = local_928.data._M_elems[4];
        local_538.m_backend.data._M_elems[5] = local_928.data._M_elems[5];
        local_538.m_backend.data._M_elems[6] = local_928.data._M_elems[6];
        local_538.m_backend.data._M_elems[7] = local_928.data._M_elems[7];
        local_538.m_backend.data._M_elems[0] = local_928.data._M_elems[0];
        local_538.m_backend.data._M_elems[1] = local_928.data._M_elems[1];
        local_538.m_backend.data._M_elems[2] = local_928.data._M_elems[2];
        local_538.m_backend.data._M_elems[3] = local_928.data._M_elems[3];
        local_538.m_backend.exp = local_928.exp;
        local_538.m_backend.neg = local_928.neg;
        local_538.m_backend.fpclass = local_928.fpclass;
        local_538.m_backend.prec_elem = local_928.prec_elem;
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&local_120,*pdVar11,(type *)0x0);
        local_588.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_588.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_588.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_588.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_588.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_588.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_588.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_588.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_588.m_backend.exp = (eps->m_backend).exp;
        local_588.m_backend.neg = (eps->m_backend).neg;
        local_588.m_backend.fpclass = (eps->m_backend).fpclass;
        local_588.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar9 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_538,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_120,&local_588);
        if (bVar9) {
          local_5d8.m_backend.data._M_elems[0xf] = local_978.data._M_elems[0xf];
          local_5d8.m_backend.data._M_elems[0xe] = local_978.data._M_elems[0xe];
          local_5d8.m_backend.data._M_elems[0xc] = local_978.data._M_elems[0xc];
          local_5d8.m_backend.data._M_elems[0xd] = local_978.data._M_elems[0xd];
          local_5d8.m_backend.data._M_elems[8] = local_978.data._M_elems[8];
          local_5d8.m_backend.data._M_elems[9] = local_978.data._M_elems[9];
          local_5d8.m_backend.data._M_elems[10] = local_978.data._M_elems[10];
          local_5d8.m_backend.data._M_elems[0xb] = local_978.data._M_elems[0xb];
          local_5d8.m_backend.data._M_elems[4] = local_978.data._M_elems[4];
          local_5d8.m_backend.data._M_elems[5] = local_978.data._M_elems[5];
          local_5d8.m_backend.data._M_elems[6] = local_978.data._M_elems[6];
          local_5d8.m_backend.data._M_elems[7] = local_978.data._M_elems[7];
          local_5d8.m_backend.data._M_elems[0] = local_978.data._M_elems[0];
          local_5d8.m_backend.data._M_elems[1] = local_978.data._M_elems[1];
          local_5d8.m_backend.data._M_elems[2] = local_978.data._M_elems[2];
          local_5d8.m_backend.data._M_elems[3] = local_978.data._M_elems[3];
          local_5d8.m_backend.exp = local_978.exp;
          local_5d8.m_backend.neg = local_978.neg;
          local_5d8.m_backend.fpclass = local_978.fpclass;
          local_5d8.m_backend.prec_elem = local_978.prec_elem;
          local_628.m_backend.data._M_elems[0xf] = local_928.data._M_elems[0xf];
          local_628.m_backend.data._M_elems[0xe] = local_928.data._M_elems[0xe];
          local_628.m_backend.data._M_elems[0] = local_928.data._M_elems[0];
          local_628.m_backend.data._M_elems[1] = local_928.data._M_elems[1];
          local_628.m_backend.data._M_elems[2] = local_928.data._M_elems[2];
          local_628.m_backend.data._M_elems[3] = local_928.data._M_elems[3];
          local_628.m_backend.data._M_elems[4] = local_928.data._M_elems[4];
          local_628.m_backend.data._M_elems[5] = local_928.data._M_elems[5];
          local_628.m_backend.data._M_elems[6] = local_928.data._M_elems[6];
          local_628.m_backend.data._M_elems[7] = local_928.data._M_elems[7];
          local_628.m_backend.data._M_elems[8] = local_928.data._M_elems[8];
          local_628.m_backend.data._M_elems[9] = local_928.data._M_elems[9];
          local_628.m_backend.data._M_elems[10] = local_928.data._M_elems[10];
          local_628.m_backend.data._M_elems[0xb] = local_928.data._M_elems[0xb];
          local_628.m_backend.data._M_elems[0xc] = local_928.data._M_elems[0xc];
          local_628.m_backend.data._M_elems[0xd] = local_928.data._M_elems[0xd];
          local_628.m_backend.exp = local_928.exp;
          local_628.m_backend.neg = local_928.neg;
          local_628.m_backend.fpclass = local_928.fpclass;
          local_628.m_backend.prec_elem = local_928.prec_elem;
          local_678.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_678.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_678.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_678.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_678.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_678.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_678.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_678.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_678.m_backend.exp = (eps->m_backend).exp;
          local_678.m_backend.neg = (eps->m_backend).neg;
          local_678.m_backend.fpclass = (eps->m_backend).fpclass;
          local_678.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar9 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_5d8,&local_628,&local_678);
          if (bVar9) {
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems._56_5_ = 0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result_1.m_backend,&local_928,&eps->m_backend);
            local_8b0 = &pnVar2[lVar13].m_backend;
            tVar10 = boost::multiprecision::operator>=
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&pnVar2[lVar13].m_backend,&result_1);
            if ((tVar10) &&
               (*(int *)(p_delta.m_backend.data._M_elems._8_8_ + lVar13 * 4) * local_8d0->theRep < 0
               )) {
              dVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                      extract_double(&minrandom.m_backend);
              dVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                      extract_double(&maxrandom.m_backend);
              local_990 = Random::next(local_8b8,dVar5,dVar6);
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems._56_5_ = 0;
              result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                        (&result_1.m_backend,local_8b0,&local_990);
              pnVar4 = (local_8c0->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x30);
              *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._48_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT35(result_1.m_backend.data._M_elems[0xf]._1_3_,
                            result_1.m_backend.data._M_elems._56_5_);
              puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x20);
              *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._32_8_;
              *(undefined8 *)(puVar1 + 2) = result_1.m_backend.data._M_elems._40_8_;
              puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x10);
              *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
              *(undefined8 *)(puVar1 + 2) = result_1.m_backend.data._M_elems._24_8_;
              *(undefined8 *)&pnVar4[lVar13].m_backend.data = result_1.m_backend.data._M_elems._0_8_
              ;
              *(undefined8 *)((long)&pnVar4[lVar13].m_backend.data + 8) =
                   result_1.m_backend.data._M_elems._8_8_;
              pnVar4[lVar13].m_backend.exp = result_1.m_backend.exp;
              pnVar4[lVar13].m_backend.neg = result_1.m_backend.neg;
              pnVar4[lVar13].m_backend.fpclass = result_1.m_backend.fpclass;
              pnVar4[lVar13].m_backend.prec_elem = result_1.m_backend.prec_elem;
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems._56_5_ = 0;
              result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        (&result_1.m_backend,
                         &(local_8c0->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend,&local_928);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_988,&result_1.m_backend);
            }
          }
        }
      }
      else {
        result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        result_1.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2)
        ;
        result_1.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        result_1.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        result_1.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        result_1.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        result_1.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        uVar7 = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        result_1.m_backend.data._M_elems._56_5_ = SUB85(uVar7,0);
        result_1.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
        result_1.m_backend.exp = (eps->m_backend).exp;
        result_1.m_backend.neg = (eps->m_backend).neg;
        result_1.m_backend.fpclass = (eps->m_backend).fpclass;
        result_1.m_backend.prec_elem = (eps->m_backend).prec_elem;
        if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
            result_1.m_backend.data._M_elems[0] != 0) {
          result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
        }
        tVar10 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_8a8,&result_1);
        if (tVar10) {
          local_6c8.m_backend.data._M_elems[0xc] = local_978.data._M_elems[0xc];
          local_6c8.m_backend.data._M_elems[0xd] = local_978.data._M_elems[0xd];
          local_6c8.m_backend.data._M_elems[0xe] = local_978.data._M_elems[0xe];
          local_6c8.m_backend.data._M_elems[0xf] = local_978.data._M_elems[0xf];
          local_6c8.m_backend.data._M_elems[8] = local_978.data._M_elems[8];
          local_6c8.m_backend.data._M_elems[9] = local_978.data._M_elems[9];
          local_6c8.m_backend.data._M_elems[10] = local_978.data._M_elems[10];
          local_6c8.m_backend.data._M_elems[0xb] = local_978.data._M_elems[0xb];
          local_6c8.m_backend.data._M_elems[4] = local_978.data._M_elems[4];
          local_6c8.m_backend.data._M_elems[5] = local_978.data._M_elems[5];
          local_6c8.m_backend.data._M_elems[6] = local_978.data._M_elems[6];
          local_6c8.m_backend.data._M_elems[7] = local_978.data._M_elems[7];
          local_6c8.m_backend.data._M_elems[0] = local_978.data._M_elems[0];
          local_6c8.m_backend.data._M_elems[1] = local_978.data._M_elems[1];
          local_6c8.m_backend.data._M_elems[2] = local_978.data._M_elems[2];
          local_6c8.m_backend.data._M_elems[3] = local_978.data._M_elems[3];
          local_6c8.m_backend.exp = local_978.exp;
          local_6c8.m_backend.neg = local_978.neg;
          local_6c8.m_backend.fpclass = local_978.fpclass;
          local_6c8.m_backend.prec_elem = local_978.prec_elem;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&local_170,-*pdVar11,(type *)0x0);
          local_718.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_718.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_718.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_718.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_718.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_718.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_718.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_718.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_718.m_backend.exp = (eps->m_backend).exp;
          local_718.m_backend.neg = (eps->m_backend).neg;
          local_718.m_backend.fpclass = (eps->m_backend).fpclass;
          local_718.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar9 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_6c8,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_170,&local_718);
          if (bVar9) {
            local_768.m_backend.data._M_elems[0xf] = local_978.data._M_elems[0xf];
            local_768.m_backend.data._M_elems[0xe] = local_978.data._M_elems[0xe];
            local_768.m_backend.data._M_elems[0xc] = local_978.data._M_elems[0xc];
            local_768.m_backend.data._M_elems[0xd] = local_978.data._M_elems[0xd];
            local_768.m_backend.data._M_elems[8] = local_978.data._M_elems[8];
            local_768.m_backend.data._M_elems[9] = local_978.data._M_elems[9];
            local_768.m_backend.data._M_elems[10] = local_978.data._M_elems[10];
            local_768.m_backend.data._M_elems[0xb] = local_978.data._M_elems[0xb];
            local_768.m_backend.data._M_elems[4] = local_978.data._M_elems[4];
            local_768.m_backend.data._M_elems[5] = local_978.data._M_elems[5];
            local_768.m_backend.data._M_elems[6] = local_978.data._M_elems[6];
            local_768.m_backend.data._M_elems[7] = local_978.data._M_elems[7];
            local_768.m_backend.data._M_elems[0] = local_978.data._M_elems[0];
            local_768.m_backend.data._M_elems[1] = local_978.data._M_elems[1];
            local_768.m_backend.data._M_elems[2] = local_978.data._M_elems[2];
            local_768.m_backend.data._M_elems[3] = local_978.data._M_elems[3];
            local_768.m_backend.exp = local_978.exp;
            local_768.m_backend.neg = local_978.neg;
            local_768.m_backend.fpclass = local_978.fpclass;
            local_768.m_backend.prec_elem = local_978.prec_elem;
            local_7b8.m_backend.data._M_elems[0xf] = local_928.data._M_elems[0xf];
            local_7b8.m_backend.data._M_elems[0xe] = local_928.data._M_elems[0xe];
            local_7b8.m_backend.data._M_elems[0] = local_928.data._M_elems[0];
            local_7b8.m_backend.data._M_elems[1] = local_928.data._M_elems[1];
            local_7b8.m_backend.data._M_elems[2] = local_928.data._M_elems[2];
            local_7b8.m_backend.data._M_elems[3] = local_928.data._M_elems[3];
            local_7b8.m_backend.data._M_elems[4] = local_928.data._M_elems[4];
            local_7b8.m_backend.data._M_elems[5] = local_928.data._M_elems[5];
            local_7b8.m_backend.data._M_elems[6] = local_928.data._M_elems[6];
            local_7b8.m_backend.data._M_elems[7] = local_928.data._M_elems[7];
            local_7b8.m_backend.data._M_elems[8] = local_928.data._M_elems[8];
            local_7b8.m_backend.data._M_elems[9] = local_928.data._M_elems[9];
            local_7b8.m_backend.data._M_elems[10] = local_928.data._M_elems[10];
            local_7b8.m_backend.data._M_elems[0xb] = local_928.data._M_elems[0xb];
            local_7b8.m_backend.data._M_elems[0xc] = local_928.data._M_elems[0xc];
            local_7b8.m_backend.data._M_elems[0xd] = local_928.data._M_elems[0xd];
            local_7b8.m_backend.exp = local_928.exp;
            local_7b8.m_backend.neg = local_928.neg;
            local_7b8.m_backend.fpclass = local_928.fpclass;
            local_7b8.m_backend.prec_elem = local_928.prec_elem;
            local_808.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
            local_808.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 2);
            local_808.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 4);
            local_808.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 6);
            local_808.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 8);
            local_808.m_backend.data._M_elems._40_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 10);
            local_808.m_backend.data._M_elems._48_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
            local_808.m_backend.data._M_elems._56_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
            local_808.m_backend.exp = (eps->m_backend).exp;
            local_808.m_backend.neg = (eps->m_backend).neg;
            local_808.m_backend.fpclass = (eps->m_backend).fpclass;
            local_808.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar9 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_768,&local_7b8,&local_808);
            if (bVar9) {
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems._56_5_ = 0;
              result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        (&result_1.m_backend,&local_978,&eps->m_backend);
              tVar10 = boost::multiprecision::operator<=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&pnVar2[lVar13].m_backend,&result_1);
              if ((tVar10) &&
                 (*(int *)(p_delta.m_backend.data._M_elems._8_8_ + lVar13 * 4) * local_8d0->theRep <
                  0)) {
                dVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        extract_double(&minrandom.m_backend);
                dVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        extract_double(&maxrandom.m_backend);
                local_990 = Random::next(local_8b8,dVar5,dVar6);
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x10;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems._56_5_ = 0;
                result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                          (&result_1.m_backend,&pnVar2[lVar13].m_backend,&local_990);
                pnVar4 = (local_8c8->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x30);
                *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._48_8_;
                *(ulong *)(puVar1 + 2) =
                     CONCAT35(result_1.m_backend.data._M_elems[0xf]._1_3_,
                              result_1.m_backend.data._M_elems._56_5_);
                puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x20);
                *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._32_8_;
                *(undefined8 *)(puVar1 + 2) = result_1.m_backend.data._M_elems._40_8_;
                puVar1 = (uint *)((long)&pnVar4[lVar13].m_backend.data + 0x10);
                *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
                *(undefined8 *)(puVar1 + 2) = result_1.m_backend.data._M_elems._24_8_;
                *(undefined8 *)&pnVar4[lVar13].m_backend.data =
                     result_1.m_backend.data._M_elems._0_8_;
                *(undefined8 *)((long)&pnVar4[lVar13].m_backend.data + 8) =
                     result_1.m_backend.data._M_elems._8_8_;
                pnVar4[lVar13].m_backend.exp = result_1.m_backend.exp;
                pnVar4[lVar13].m_backend.neg = result_1.m_backend.neg;
                pnVar4[lVar13].m_backend.fpclass = result_1.m_backend.fpclass;
                pnVar4[lVar13].m_backend.prec_elem = result_1.m_backend.prec_elem;
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x10;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems._56_5_ = 0;
                result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          (&result_1.m_backend,
                           &(local_8c8->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend,&local_978);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (local_988,&result_1.m_backend);
              }
            }
          }
        }
      }
    }
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_988;
}

Assistant:

R SPxSolverBase<R>::perturbMax(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   const typename SPxBasisBase<R>::Desc::Status* stat,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;
   R l_theShift = 0;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps && rep() * stat[i] < 0)
         {
            p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
            l_theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps && rep() * stat[i] < 0)
         {
            p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
            l_theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         if(x > eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps && rep() * stat[i] < 0)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               l_theShift += p_up[i] - u;
            }
         }
         else if(x < -eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps && rep() * stat[i] < 0)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               l_theShift -= p_low[i] - l;
            }
         }
      }
   }

   return l_theShift;
}